

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BuildEngine.cpp
# Opt level: O1

void __thiscall
anon_unknown.dwarf_1cc25c::BuildEngineImpl::addTaskInputRequest
          (BuildEngineImpl *this,Task *task,KeyType *key,uintptr_t inputID,bool orderOnly,
          bool singleUse)

{
  int iVar1;
  TaskInfo *pTVar2;
  RuleInfo *pRVar3;
  value_type local_50;
  
  pTVar2 = getTaskInfo(this,task);
  if (pTVar2->forRuleInfo->state != InProgressWaiting) {
    abort();
  }
  pRVar3 = getRuleInfoForKey(this,key);
  iVar1 = pthread_mutex_lock((pthread_mutex_t *)&this->inputRequestsMutex);
  if (iVar1 == 0) {
    local_50.forcePriorValue = false;
    local_50.taskInfo = pTVar2;
    local_50.inputID = inputID;
    local_50.inputRuleInfo = pRVar3;
    local_50.orderOnly = orderOnly;
    local_50.singleUse = singleUse;
    std::
    deque<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest,_std::allocator<(anonymous_namespace)::BuildEngineImpl::TaskInputRequest>_>
    ::push_back(&this->inputRequests,&local_50);
    pTVar2->waitCount = pTVar2->waitCount + 1;
    pthread_mutex_unlock((pthread_mutex_t *)&this->inputRequestsMutex);
    return;
  }
  std::__throw_system_error(iVar1);
}

Assistant:

void addTaskInputRequest(Task* task, const KeyType& key, uintptr_t inputID, bool orderOnly, bool singleUse) {
    auto taskInfo = getTaskInfo(task);

    // Validate that the task is in a valid state to request inputs.
    if (!taskInfo->forRuleInfo->isInProgressWaiting()) {
      // FIXME: Error handling.
      abort();
    }

    // Lookup the rule for this task.
    RuleInfo* ruleInfo = &getRuleInfoForKey(key);

    std::lock_guard<std::mutex> guard(inputRequestsMutex);
    inputRequests.push_back({ taskInfo, inputID, ruleInfo, orderOnly, false, singleUse });
    taskInfo->waitCount++;
  }